

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void plot_masked_sprite_16px(tgestate_t *state,vischar_t *vischar)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  byte *pbVar4;
  bool bVar5;
  byte x;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  long lVar12;
  byte bVar13;
  ulong uVar14;
  byte bVar15;
  byte bVar16;
  ulong uVar17;
  byte *pbVar18;
  byte bVar19;
  
  x = (byte)(vischar->isopos).x & 7;
  if (x < 4) {
    plot_masked_sprite_16px_right(state,x);
    return;
  }
  bVar11 = x - 4;
  puVar2 = state->bitmap_pointer;
  puVar3 = state->mask_pointer;
  uVar1 = (state->spriteplotter).height_16_right;
  lVar12 = 0;
  do {
    bVar16 = puVar2[lVar12 * 2];
    bVar13 = puVar2[lVar12 * 2 + 1];
    bVar6 = puVar3[lVar12 * 2];
    bVar7 = puVar3[lVar12 * 2 + 1];
    if ((char)state->sprite_index < '\0') {
      uVar17 = (ulong)bVar16;
      uVar14 = (ulong)bVar6;
      bVar6 = state->reversed[bVar7];
      bVar7 = state->reversed[uVar14];
      bVar16 = state->reversed[bVar13];
      bVar13 = state->reversed[uVar17];
    }
    if (x == 4) {
      bVar10 = bVar7 * '\x02' + 1;
      bVar19 = bVar6 >> 7;
      bVar6 = bVar6 * '\x02' | bVar7 >> 7;
      bVar19 = bVar19 | 0xfe;
LAB_0010b7f6:
      bVar7 = bVar10 * '\x02' + 1;
      bVar10 = bVar6 * '\x02' | bVar10 >> 7;
      bVar19 = bVar19 * '\x02' | bVar6 >> 7;
      bVar5 = true;
LAB_0010b81a:
      if (x == 4) {
        bVar6 = bVar13 * '\x02';
        bVar8 = bVar16 >> 7;
        bVar16 = bVar16 * '\x02' | bVar13 >> 7;
      }
      else {
        bVar8 = 0;
        bVar6 = bVar13;
      }
      bVar15 = bVar16;
      bVar13 = bVar6;
      if (bVar5) {
        bVar13 = bVar6 * '\x02';
        bVar15 = bVar16 * '\x02' | bVar6 >> 7;
        bVar8 = bVar8 * '\x02' | bVar16 >> 7;
      }
      bVar19 = (byte)(bVar10 * '\x02') >> 7 | bVar10 >> 6 & 2 | bVar19 << 2;
      bVar9 = bVar8 * '\x02' | bVar15 >> 7;
      bVar8 = bVar15 * '\x02' | bVar13 >> 7;
      bVar16 = bVar13 * '\x02';
      bVar6 = bVar7 >> 6 & 1 | (bVar7 >> 7 | bVar10 * '\x02') * '\x02';
      bVar7 = bVar7 * '\x04' | 3;
LAB_0010b8ba:
      bVar13 = bVar16 * '\x02';
      bVar16 = bVar8 * '\x02' | bVar16 >> 7;
      bVar10 = bVar9 * '\x02' | bVar8 >> 7;
    }
    else {
      bVar19 = 0xff;
      bVar10 = bVar7;
      if (bVar11 == 1) goto LAB_0010b7f6;
      if (bVar11 < 3) {
        bVar5 = false;
        bVar10 = bVar6;
        goto LAB_0010b81a;
      }
      if (bVar11 == 3) {
        bVar19 = bVar6 >> 7 | 0xfe;
        bVar9 = 0;
        bVar8 = bVar16;
        bVar16 = bVar13;
        bVar6 = bVar6 * '\x02' | bVar7 >> 7;
        bVar7 = bVar7 * '\x02' + 1;
        goto LAB_0010b8ba;
      }
      bVar19 = 0xff;
      bVar10 = 0;
    }
    pbVar4 = state->foreground_mask_pointer;
    pbVar18 = state->window_buf_pointer;
    if ((state->spriteplotter).enable_16_right_1 != '\0') {
      *pbVar18 = bVar10 & *pbVar4 | (bVar19 | ~*pbVar4) & *pbVar18;
    }
    if ((state->spriteplotter).enable_16_right_2 != '\0') {
      pbVar18[1] = bVar16 & pbVar4[1] | (bVar6 | ~pbVar4[1]) & pbVar18[1];
    }
    pbVar18 = pbVar18 + 2;
    if ((state->spriteplotter).enable_16_right_3 != '\0') {
      *pbVar18 = bVar13 & pbVar4[2] | (bVar7 | ~pbVar4[2]) & *pbVar18;
    }
    state->foreground_mask_pointer = pbVar4 + 4;
    state->window_buf_pointer = pbVar18 + (long)state->columns + -2;
    lVar12 = lVar12 + 1;
    if (uVar1 == (uint8_t)lVar12) {
      return;
    }
  } while( true );
}

Assistant:

void plot_masked_sprite_16px(tgestate_t *state, vischar_t *vischar)
{
  uint8_t x; /* was A */

  ASSERT_VISCHAR_VALID(vischar);

  x = vischar->isopos.x & 7;
  if (x < 4)
    plot_masked_sprite_16px_right(state, x); /* was fallthrough */
  else
    plot_masked_sprite_16px_left(state, x);
}